

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O0

shared_ptr<int> __thiscall
Infector::AnyShared<BedRoomVS,_IRoomVS>::getReferenceCounter(AnyShared<BedRoomVS,_IRoomVS> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<int> sVar1;
  AnyShared<BedRoomVS,_IRoomVS> *this_local;
  
  std::shared_ptr<int>::shared_ptr<BedRoomVS>
            ((shared_ptr<int> *)this,(shared_ptr<BedRoomVS> *)(in_RSI + 0x10),
             (element_type *)(in_RSI + 8));
  sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<int>)sVar1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<int> getReferenceCounter()override{
            return std::shared_ptr<int>(ist,&a);
        }